

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moc.cpp
# Opt level: O1

void FunctionDef::accessToJson(QJsonObject *obj,Access acs)

{
  char *pcVar1;
  qsizetype qVar2;
  long in_FS_OFFSET;
  QLatin1String QVar3;
  QLatin1String QVar4;
  undefined1 local_40 [16];
  QJsonValue local_30 [24];
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  if (acs == Public) {
    pcVar1 = "public";
    qVar2 = 6;
  }
  else if (acs == Protected) {
    pcVar1 = "protected";
    qVar2 = 9;
  }
  else {
    if (acs != Private) goto LAB_00121e1d;
    pcVar1 = "private";
    qVar2 = 7;
  }
  QVar4.m_data = pcVar1;
  QVar4.m_size = qVar2;
  QJsonValue::QJsonValue(local_30,QVar4);
  QVar3.m_data = (char *)0x6;
  QVar3.m_size = (qsizetype)obj;
  local_40 = QJsonObject::operator[](QVar3);
  QJsonValueRef::operator=((QJsonValueRef *)local_40,local_30);
  QJsonValue::~QJsonValue(local_30);
LAB_00121e1d:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void FunctionDef::accessToJson(QJsonObject *obj, FunctionDef::Access acs)
{
    switch (acs) {
    case Private: (*obj)["access"_L1] = "private"_L1; break;
    case Public: (*obj)["access"_L1] = "public"_L1; break;
    case Protected: (*obj)["access"_L1] = "protected"_L1; break;
    }
}